

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * __thiscall lest::env::context_abi_cxx11_(env *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  env *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_30 [48];
  
  __lhs = in_RDI;
  sections_abi_cxx11_(in_stack_00000018);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

text context() { return testing + sections(); }